

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataI2c.cpp
# Opt level: O2

size_t __thiscall remote_wiring::FirmataI2c::_available(FirmataI2c *this)

{
  size_type sVar1;
  
  std::mutex::lock(&this->_rx_mutex);
  sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_rx);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_rx_mutex);
  return sVar1;
}

Assistant:

size_t
FirmataI2c::_available (
    void
) {
    std::lock_guard<std::mutex> lock(_rx_mutex);
    return _rx.size();
}